

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int I420Rect(uint8_t *dst_y,int dst_stride_y,uint8_t *dst_u,int dst_stride_u,uint8_t *dst_v,
            int dst_stride_v,int x,int y,int width,int height,int value_y,int value_u,int value_v)

{
  int iVar1;
  uint width_00;
  
  iVar1 = -1;
  if ((uint)(value_v | value_u) < 0x100 &&
      ((value_y < 0x100 && -1 < (y | x | value_y)) &&
      (height != 0 &&
      (0 < width &&
      (dst_v != (uint8_t *)0x0 && (dst_u != (uint8_t *)0x0 && dst_y != (uint8_t *)0x0)))))) {
    iVar1 = height + 1 >> 1;
    width_00 = width + 1U >> 1;
    SetPlane(dst_y + (long)(y * dst_stride_y) + (long)x,dst_stride_y,width,height,value_y);
    SetPlane(dst_u + (long)((y / 2) * dst_stride_u) + (long)(x / 2),dst_stride_u,width_00,iVar1,
             value_u);
    SetPlane(dst_v + (long)((y / 2) * dst_stride_v) + (long)(x / 2),dst_stride_v,width_00,iVar1,
             value_v);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420Rect(uint8_t* dst_y,
             int dst_stride_y,
             uint8_t* dst_u,
             int dst_stride_u,
             uint8_t* dst_v,
             int dst_stride_v,
             int x,
             int y,
             int width,
             int height,
             int value_y,
             int value_u,
             int value_v) {
  int halfwidth = (width + 1) >> 1;
  int halfheight = (height + 1) >> 1;
  uint8_t* start_y = dst_y + y * dst_stride_y + x;
  uint8_t* start_u = dst_u + (y / 2) * dst_stride_u + (x / 2);
  uint8_t* start_v = dst_v + (y / 2) * dst_stride_v + (x / 2);
  if (!dst_y || !dst_u || !dst_v || width <= 0 || height == 0 || x < 0 ||
      y < 0 || value_y < 0 || value_y > 255 || value_u < 0 || value_u > 255 ||
      value_v < 0 || value_v > 255) {
    return -1;
  }

  SetPlane(start_y, dst_stride_y, width, height, value_y);
  SetPlane(start_u, dst_stride_u, halfwidth, halfheight, value_u);
  SetPlane(start_v, dst_stride_v, halfwidth, halfheight, value_v);
  return 0;
}